

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int luv_shutdown(lua_State *L)

{
  int iVar1;
  uv_stream_t *stream;
  uv_shutdown_t *req_00;
  luv_req_t *plVar2;
  int ret;
  uv_shutdown_t *req;
  int ref;
  uv_stream_t *handle;
  lua_State *L_local;
  
  stream = luv_check_stream(L,1);
  iVar1 = luv_check_continuation(L,2);
  req_00 = (uv_shutdown_t *)lua_newuserdata(L,0x50);
  plVar2 = luv_setup_req(L,iVar1);
  req_00->data = plVar2;
  iVar1 = uv_shutdown(req_00,stream,luv_shutdown_cb);
  if (iVar1 < 0) {
    luv_cleanup_req(L,(luv_req_t *)req_00->data);
    lua_settop(L,-2);
    L_local._4_4_ = luv_error(L,iVar1);
  }
  else {
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_shutdown(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_stream_t* handle = luv_check_stream(L, 1);
  int ref = luv_check_continuation(L, 2);
  uv_shutdown_t* req = (uv_shutdown_t*)lua_newuserdata(L, sizeof(*req));
  int ret;
  req->data = luv_setup_req(L, ctx, ref);
  ret = uv_shutdown(req, handle, luv_shutdown_cb);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  return 1;
}